

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_4402ef::PointerToMemberType::printRight
          (PointerToMemberType *this,OutputStream *s)

{
  int iVar1;
  Node *pNVar2;
  
  pNVar2 = this->MemberType;
  if (pNVar2->ArrayCache != Yes) {
    if (pNVar2->ArrayCache == Unknown) {
      iVar1 = (*pNVar2->_vptr_Node[1])(pNVar2,s);
      if ((char)iVar1 != '\0') goto LAB_001b6f14;
      pNVar2 = this->MemberType;
    }
    if (pNVar2->FunctionCache != Yes) {
      if (pNVar2->FunctionCache != Unknown) goto LAB_001b6f30;
      iVar1 = (*pNVar2->_vptr_Node[2])(pNVar2,s);
      if ((char)iVar1 == '\0') goto LAB_001b6f30;
    }
  }
LAB_001b6f14:
  OutputStream::grow(s,1);
  s->Buffer[s->CurrentPosition] = ')';
  s->CurrentPosition = s->CurrentPosition + 1;
LAB_001b6f30:
  (*this->MemberType->_vptr_Node[5])(this->MemberType,s);
  return;
}

Assistant:

void printRight(OutputStream &s) const override {
    if (MemberType->hasArray(s) || MemberType->hasFunction(s))
      s += ")";
    MemberType->printRight(s);
  }